

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O3

void __thiscall
tchecker::clockbounds::local_lu_map_t::local_lu_map_t(local_lu_map_t *this,local_lu_map_t *m)

{
  map_t *pmVar1;
  ulong uVar2;
  allocator_type local_39;
  value_type local_38;
  
  uVar2._0_4_ = m->_loc_nb;
  uVar2._4_4_ = m->_clock_nb;
  this->_loc_nb = (undefined4)uVar2;
  this->_clock_nb = uVar2._4_4_;
  local_38 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_L,uVar2 & 0xffffffff,&local_38,&local_39);
  local_38 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_U,(ulong)this->_loc_nb,&local_38,&local_39);
  if (this->_loc_nb != 0) {
    uVar2 = 0;
    do {
      pmVar1 = clone_map((m->_L).
                         super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar2]);
      (this->_L).
      super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar2] = pmVar1;
      pmVar1 = clone_map((m->_U).
                         super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar2]);
      (this->_U).
      super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar2] = pmVar1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->_loc_nb);
  }
  return;
}

Assistant:

local_lu_map_t::local_lu_map_t(tchecker::clockbounds::local_lu_map_t const & m)
    : _loc_nb(m._loc_nb), _clock_nb(m._clock_nb), _L(_loc_nb, nullptr), _U(_loc_nb, nullptr)
{
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id) {
    _L[id] = tchecker::clockbounds::clone_map(*m._L[id]);
    _U[id] = tchecker::clockbounds::clone_map(*m._U[id]);
  }
}